

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall exe_reconstructor::o32exe::appendexedata(o32exe *this,ByteVector *hdr)

{
  pointer puVar1;
  size_type sVar2;
  pointer pcVar3;
  ulong uVar4;
  long lVar5;
  undefined8 *puVar6;
  size_t __len;
  long lVar7;
  
  if ((this->name)._M_string_length < 8) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (hdr,(size_type)
                   ((hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                    .super__Vector_impl_data._M_finish +
                   (0x28 - (long)(hdr->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_start)));
    puVar1 = (hdr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    sVar2 = (this->name)._M_string_length;
    if (0 < (long)sVar2) {
      pcVar3 = (this->name)._M_dataplus._M_p;
      lVar5 = sVar2 + 1;
      lVar7 = 0;
      do {
        puVar1[lVar7 + -0x28] = pcVar3[lVar7];
        lVar5 = lVar5 + -1;
        lVar7 = lVar7 + 1;
      } while (1 < lVar5);
    }
    uVar4 = (this->name)._M_string_length;
    if (uVar4 < 8) {
      memset(puVar1 + (uVar4 - 0x28),0,8 - uVar4);
    }
    *(uint32_t *)(puVar1 + -0x20) = this->vsize;
    *(uint32_t *)(puVar1 + -0x1c) = this->rva;
    *(uint32_t *)(puVar1 + -0x18) = this->psize;
    *(uint32_t *)(puVar1 + -0x14) = this->dataptr;
    *(uint32_t *)(puVar1 + -0x10) = this->realaddr;
    *(uint32_t *)(puVar1 + -0xc) = this->access;
    *(uint32_t *)(puVar1 + -8) = this->temp3;
    *(uint32_t *)(puVar1 + -4) = this->flags;
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "section name > 8 chars";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

void appendexedata(ByteVector& hdr)
        {
            if (name.size()>=8)
                throw "section name > 8 chars";

            hdr.resize(hdr.size()+o32exe::size());
            uint8_t *p= &hdr[hdr.size()-o32exe::size()];
            std::copy(name.begin(), name.end(), p);
            if (name.size()<8)
                std::fill_n(p+name.size(), 8-name.size(), uint8_t(0));

            set32le(p+0x0008, vsize);
            set32le(p+0x000c, rva);
            set32le(p+0x0010, psize);
            set32le(p+0x0014, dataptr);
            set32le(p+0x0018, realaddr);
            set32le(p+0x001c, access);
            set32le(p+0x0020, temp3);
            set32le(p+0x0024, flags);
        }